

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void parse_version(string *full_version_string,string *version,int *extension_level)

{
  int iVar1;
  char *pcVar2;
  unique_ptr<char[],_std::default_delete<char[]>_> vp;
  
  QUtil::make_unique_cstr((QUtil *)&vp,full_version_string);
  pcVar2 = strchr((char *)vp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl,0x2e);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strchr(pcVar2 + 1,0x2e);
    if ((pcVar2 != (char *)0x0) && (pcVar2[1] != '\0')) {
      *pcVar2 = '\0';
      iVar1 = QUtil::string_to_int(pcVar2 + 1);
      *extension_level = iVar1;
    }
  }
  std::__cxx11::string::assign((char *)version);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&vp);
  return;
}

Assistant:

static void
parse_version(std::string const& full_version_string, std::string& version, int& extension_level)
{
    auto vp = QUtil::make_unique_cstr(full_version_string);
    char* v = vp.get();
    char* p1 = strchr(v, '.');
    char* p2 = (p1 ? strchr(1 + p1, '.') : nullptr);
    if (p2 && *(p2 + 1)) {
        *p2++ = '\0';
        extension_level = QUtil::string_to_int(p2);
    }
    version = v;
}